

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O2

void Hop_ManCleanData(Hop_Man_t *p)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  
  p->nTravIds = 1;
  (p->pConst1->field_0).pData = (void *)0x0;
  for (iVar3 = 0; iVar3 < p->vPis->nSize; iVar3 = iVar3 + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(p->vPis,iVar3);
    *puVar1 = 0;
  }
  for (iVar3 = 0; iVar3 < p->vPos->nSize; iVar3 = iVar3 + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(p->vPos,iVar3);
    *puVar1 = 0;
  }
  for (lVar2 = 0; lVar2 < p->nTableSize; lVar2 = lVar2 + 1) {
    if (p->pTable[lVar2] != (Hop_Obj_t *)0x0) {
      (p->pTable[lVar2]->field_0).pData = (void *)0x0;
    }
  }
  return;
}

Assistant:

void Hop_ManCleanData( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    p->nTravIds = 1;
    Hop_ManConst1(p)->pData = NULL;
    Hop_ManForEachPi( p, pObj, i )
        pObj->pData = NULL;
    Hop_ManForEachPo( p, pObj, i )
        pObj->pData = NULL;
    Hop_ManForEachNode( p, pObj, i )
        pObj->pData = NULL;
}